

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::string_t,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::GetBitOperator,bool>
               (string_t *ldata,int *rdata,int *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  sel_t *psVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int iVar7;
  ulong uVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  _Head_base<0UL,_unsigned_long_*,_false> _Var10;
  ulong uVar11;
  idx_t idx_in_entry;
  ulong uVar12;
  string_t input;
  string_t input_00;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_48;
  int *local_40;
  idx_t local_38;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar1 = lsel->sel_vector;
      psVar2 = rsel->sel_vector;
      uVar12 = 0;
      do {
        uVar8 = uVar12;
        if (psVar1 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar1[uVar12];
        }
        uVar11 = uVar12;
        if (psVar2 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar2[uVar12];
        }
        input.value.pointer.ptr = ldata[uVar8].value.pointer.ptr;
        input.value._0_8_ = *(undefined8 *)&ldata[uVar8].value;
        iVar7 = GetBitOperator::Operation<duckdb::string_t,int,int>(input,rdata[uVar11]);
        result_data[uVar12] = iVar7;
        uVar12 = uVar12 + 1;
      } while (count != uVar12);
    }
  }
  else if (count != 0) {
    psVar1 = lsel->sel_vector;
    psVar2 = rsel->sel_vector;
    local_48 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar12 = 0;
    local_40 = rdata;
    do {
      uVar8 = uVar12;
      if (psVar1 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar1[uVar12];
      }
      uVar11 = uVar12;
      if (psVar2 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar2[uVar12];
      }
      puVar3 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) &&
         ((puVar3 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar3 == (unsigned_long *)0x0 || ((puVar3[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)))) {
        input_00.value.pointer.ptr = ldata[uVar8].value.pointer.ptr;
        input_00.value._0_8_ = *(undefined8 *)&ldata[uVar8].value;
        iVar7 = GetBitOperator::Operation<duckdb::string_t,int,int>(input_00,rdata[uVar11]);
        result_data[uVar12] = iVar7;
      }
      else {
        _Var10._M_head_impl =
             (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var10._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var6 = p_Stack_50;
          peVar5 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar5;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var6;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_48);
          _Var10._M_head_impl =
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var10._M_head_impl;
          rdata = local_40;
        }
        bVar4 = (byte)uVar12 & 0x3f;
        _Var10._M_head_impl[uVar12 >> 6] =
             _Var10._M_head_impl[uVar12 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4)
        ;
      }
      uVar12 = uVar12 + 1;
    } while (count != uVar12);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}